

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::exceptions::invalid_option_format::invalid_option_format
          (invalid_option_format *this,string *format)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *format_local;
  invalid_option_format *this_local;
  
  local_18 = format;
  format_local = (string *)this;
  std::operator+(&local_78,"Invalid option format ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::LQUOTE_abi_cxx11_);
  std::operator+(&local_58,&local_78,local_18);
  std::operator+(&local_38,&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::RQUOTE_abi_cxx11_);
  specification::specification(&this->super_specification,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  *(undefined ***)&(this->super_specification).super_exception =
       &PTR__invalid_option_format_00298c58;
  return;
}

Assistant:

explicit invalid_option_format(const std::string& format)
  : specification("Invalid option format " + LQUOTE + format + RQUOTE)
  {
  }